

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressBegin_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  ZSTD_compressionParameters *cParams;
  ZSTD_strategy ZVar1;
  U32 UVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  undefined4 uVar7;
  void *pvVar5;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  ZSTD_compressionParameters cPar;
  U32 UVar14;
  U32 end;
  int iVar15;
  uint uVar16;
  ZSTD_TraceCtx ZVar17;
  size_t sVar18;
  ulong uVar19;
  size_t __n;
  uint uVar20;
  ZSTD_matchState_t *srcMatchState;
  size_t tagTableSize;
  size_t sVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  ZSTD_CCtx_params local_108;
  
  sVar18 = dictSize;
  if (cdict != (ZSTD_CDict *)0x0) {
    sVar18 = cdict->dictContentSize;
  }
  ZVar17 = duckdb_zstd::ZSTD_trace_compress_begin(cctx);
  cctx->traceCtx = ZVar17;
  if ((((cdict == (ZSTD_CDict *)0x0) || (sVar21 = cdict->dictContentSize, sVar21 == 0)) ||
      ((0x1ffff < pledgedSrcSize &&
       (((pledgedSrcSize != 0xffffffffffffffff &&
         (sVar21 * 6 < pledgedSrcSize || sVar21 * 6 - pledgedSrcSize == 0)) &&
        (cdict->compressionLevel != 0)))))) || (params->attachDictPref == ZSTD_dictForceLoad)) {
    sVar21 = ZSTD_resetCCtx_internal(cctx,params,pledgedSrcSize,sVar18,ZSTDcrp_makeClean,zbuff);
    if (0xffffffffffffff88 < sVar21) {
      return sVar21;
    }
    if (cdict == (ZSTD_CDict *)0x0) {
      uVar22 = SUB84(cctx->entropyWorkspace,0);
      uVar23 = (undefined4)((ulong)cctx->entropyWorkspace >> 0x20);
    }
    else {
      dict = cdict->dictContent;
      dictContentType = cdict->dictContentType;
      uVar22 = SUB84(cctx->entropyWorkspace,0);
      uVar23 = (undefined4)((ulong)cctx->entropyWorkspace >> 0x20);
      dictSize = cdict->dictContentSize;
    }
    sVar21 = ZSTD_compress_insertDictionary
                       ((cctx->blockState).prevCBlock,&(cctx->blockState).matchState,&cctx->ldmState
                        ,&cctx->workspace,&cctx->appliedParams,dict,dictSize,dictContentType,dtlm,
                        ZSTD_tfp_forCCtx,(void *)CONCAT44(uVar23,uVar22));
    if (0xffffffffffffff88 < sVar21) {
      return sVar21;
    }
    cctx->dictID = (U32)sVar21;
    cctx->dictContentSize = sVar18;
  }
  else {
    iVar15 = ZSTD_shouldAttachDict(cdict,params,pledgedSrcSize);
    if (iVar15 == 0) {
      switchD_00916250::default(&local_108,params,0xd8);
      uVar8 = (cdict->matchState).cParams.chainLog;
      uVar9 = (cdict->matchState).cParams.hashLog;
      uVar10 = (cdict->matchState).cParams.searchLog;
      uVar11 = (cdict->matchState).cParams.minMatch;
      local_108.cParams.targetLength = (cdict->matchState).cParams.targetLength;
      local_108.cParams.strategy = (cdict->matchState).cParams.strategy;
      local_108.cParams.chainLog = uVar8;
      local_108.useRowMatchFinder = cdict->useRowMatchFinder;
      local_108.cParams.hashLog = uVar9;
      local_108.cParams.searchLog = uVar10;
      local_108.cParams.minMatch = uVar11;
      sVar18 = ZSTD_resetCCtx_internal(cctx,&local_108,pledgedSrcSize,0,ZSTDcrp_leaveDirty,zbuff);
      if (0xffffffffffffff88 < sVar18) {
        return sVar18;
      }
      cParams = &(cdict->matchState).cParams;
      (cctx->workspace).tableValidEnd = (cctx->workspace).objectEnd;
      ZVar1 = (cdict->matchState).cParams.strategy;
      if ((ZVar1 == ZSTD_fast) ||
         ((ZVar1 - ZSTD_greedy < 3 && (cdict->useRowMatchFinder == ZSTD_ps_enable)))) {
        sVar18 = 0;
      }
      else {
        sVar18 = 1L << ((byte)(cdict->matchState).cParams.chainLog & 0x3f);
      }
      sVar21 = 1L << ((byte)(cdict->matchState).cParams.hashLog & 0x3f);
      ZSTD_copyCDictTableIntoCCtx
                ((cctx->blockState).matchState.hashTable,(cdict->matchState).hashTable,sVar21,
                 cParams);
      ZVar1 = (cctx->appliedParams).cParams.strategy;
      if ((ZVar1 != ZSTD_fast) &&
         ((2 < ZVar1 - ZSTD_greedy || ((cctx->appliedParams).useRowMatchFinder != ZSTD_ps_enable))))
      {
        ZSTD_copyCDictTableIntoCCtx
                  ((cctx->blockState).matchState.chainTable,(cdict->matchState).chainTable,sVar18,
                   cParams);
      }
      if ((0xfffffffc < (cdict->matchState).cParams.strategy - ZSTD_btlazy2) &&
         (cdict->useRowMatchFinder == ZSTD_ps_enable)) {
        switchD_00916250::default
                  ((cctx->blockState).matchState.tagTable,(cdict->matchState).tagTable,sVar21);
        (cctx->blockState).matchState.hashSalt = (cdict->matchState).hashSalt;
      }
      UVar2 = (cctx->blockState).matchState.hashLog3;
      __n = 0;
      if (UVar2 != 0) {
        __n = 4L << ((byte)UVar2 & 0x3f);
      }
      switchD_0049f7f1::default((cctx->blockState).matchState.hashTable3,0,__n);
      pvVar5 = (cctx->workspace).tableEnd;
      if ((cctx->workspace).tableValidEnd < pvVar5) {
        (cctx->workspace).tableValidEnd = pvVar5;
      }
      uVar22 = *(undefined4 *)&(cdict->matchState).window.field_0x24;
      (cctx->blockState).matchState.window.nbOverflowCorrections =
           (cdict->matchState).window.nbOverflowCorrections;
      *(undefined4 *)&(cctx->blockState).matchState.window.field_0x24 = uVar22;
      pBVar12 = (cdict->matchState).window.nextSrc;
      pBVar13 = (cdict->matchState).window.base;
      UVar2 = (cdict->matchState).window.dictLimit;
      UVar14 = (cdict->matchState).window.lowLimit;
      (cctx->blockState).matchState.window.dictBase = (cdict->matchState).window.dictBase;
      (cctx->blockState).matchState.window.dictLimit = UVar2;
      (cctx->blockState).matchState.window.lowLimit = UVar14;
      (cctx->blockState).matchState.window.nextSrc = pBVar12;
      (cctx->blockState).matchState.window.base = pBVar13;
      UVar2 = (cdict->matchState).nextToUpdate;
      (cctx->blockState).matchState.loadedDictEnd = (cdict->matchState).loadedDictEnd;
      (cctx->blockState).matchState.nextToUpdate = UVar2;
    }
    else {
      switchD_00916250::default(&local_108,params,0xd8);
      uVar3 = (cdict->matchState).cParams.windowLog;
      uVar6 = (cdict->matchState).cParams.chainLog;
      cPar.chainLog = uVar6;
      cPar.windowLog = uVar3;
      uVar16 = (cdict->matchState).cParams.hashLog;
      ZVar1 = (cdict->matchState).cParams.strategy;
      uVar20 = 6;
      if (6 < uVar16 - 2) {
        uVar20 = uVar16 - 2;
      }
      if (2 < ZVar1 - ZSTD_greedy) {
        uVar20 = uVar16;
      }
      if ((cdict->matchState).dedicatedDictSearch == 0) {
        uVar20 = uVar16;
      }
      uVar4 = (cdict->matchState).cParams.searchLog;
      uVar7 = (cdict->matchState).cParams.minMatch;
      uVar16 = local_108.cParams.windowLog;
      cPar.hashLog = uVar20;
      cPar.searchLog = uVar4;
      cPar.minMatch = uVar7;
      cPar.targetLength = (cdict->matchState).cParams.targetLength;
      cPar.strategy = ZVar1;
      ZSTD_adjustCParams_internal
                (&local_108.cParams,cPar,pledgedSrcSize,sVar21,ZSTD_cpm_attachDict,
                 local_108.useRowMatchFinder);
      local_108.cParams._0_8_ = CONCAT44(local_108.cParams.chainLog,uVar16);
      local_108.useRowMatchFinder = cdict->useRowMatchFinder;
      sVar18 = ZSTD_resetCCtx_internal(cctx,&local_108,pledgedSrcSize,0,ZSTDcrp_makeClean,zbuff);
      if (0xffffffffffffff88 < sVar18) {
        return sVar18;
      }
      uVar19 = (long)(cdict->matchState).window.nextSrc - (long)(cdict->matchState).window.base;
      uVar16 = (uint)uVar19;
      if ((cdict->matchState).window.dictLimit != uVar16) {
        (cctx->blockState).matchState.dictMatchState = &cdict->matchState;
        uVar20 = (cctx->blockState).matchState.window.dictLimit;
        if (uVar20 < uVar16) {
          (cctx->blockState).matchState.window.nextSrc =
               (cctx->blockState).matchState.window.base + (uVar19 & 0xffffffff);
          (cctx->blockState).matchState.window.lowLimit = uVar16;
          (cctx->blockState).matchState.window.dictLimit = uVar16;
          uVar20 = uVar16;
        }
        (cctx->blockState).matchState.loadedDictEnd = uVar20;
      }
    }
    cctx->dictID = cdict->dictID;
    cctx->dictContentSize = cdict->dictContentSize;
    switchD_00916250::default((cctx->blockState).prevCBlock,&cdict->cBlockState,0x1600);
  }
  return 0;
}

Assistant:

static size_t ZSTD_compressBegin_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    const ZSTD_CCtx_params* params, U64 pledgedSrcSize,
                                    ZSTD_buffered_policy_e zbuff)
{
    size_t const dictContentSize = cdict ? cdict->dictContentSize : dictSize;
#if ZSTD_TRACE
    cctx->traceCtx = (ZSTD_trace_compress_begin != NULL) ? ZSTD_trace_compress_begin(cctx) : 0;
#endif
    DEBUGLOG(4, "ZSTD_compressBegin_internal: wlog=%u", params->cParams.windowLog);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if ( (cdict)
      && (cdict->dictContentSize > 0)
      && ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
        || cdict->compressionLevel == 0)
      && (params->attachDictPref != ZSTD_dictForceLoad) ) {
        return ZSTD_resetCCtx_usingCDict(cctx, cdict, params, pledgedSrcSize, zbuff);
    }

    FORWARD_IF_ERROR( ZSTD_resetCCtx_internal(cctx, params, pledgedSrcSize,
                                     dictContentSize,
                                     ZSTDcrp_makeClean, zbuff) , "");
    {   size_t const dictID = cdict ?
                ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, cdict->dictContent,
                        cdict->dictContentSize, cdict->dictContentType, dtlm,
                        ZSTD_tfp_forCCtx, cctx->entropyWorkspace)
              : ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, dict, dictSize,
                        dictContentType, dtlm, ZSTD_tfp_forCCtx, cctx->entropyWorkspace);
        FORWARD_IF_ERROR(dictID, "ZSTD_compress_insertDictionary failed");
        assert(dictID <= UINT_MAX);
        cctx->dictID = (U32)dictID;
        cctx->dictContentSize = dictContentSize;
    }
    return 0;
}